

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O0

int __thiscall ncnn::MultiHeadAttention::load_model(MultiHeadAttention *this,ModelBin *mb)

{
  int *piVar1;
  void **ppvVar2;
  long *in_RSI;
  long in_RDI;
  bool bVar3;
  int qdim;
  undefined4 *local_988;
  int *local_980;
  long *local_968;
  void *local_940;
  int *local_938;
  undefined8 local_930;
  undefined4 local_928;
  long *local_920;
  undefined4 local_918;
  undefined4 local_914;
  undefined4 local_910;
  undefined4 local_90c;
  undefined4 local_908;
  undefined8 local_900;
  void *local_8f8;
  int *local_8f0;
  undefined8 local_8e8;
  undefined4 local_8e0;
  long *local_8d8;
  undefined4 local_8d0;
  undefined4 local_8cc;
  undefined4 local_8c8;
  undefined4 local_8c4;
  undefined4 local_8c0;
  undefined8 local_8b8;
  void *local_8b0;
  int *local_8a8;
  undefined8 local_8a0;
  undefined4 local_898;
  long *local_890;
  undefined4 local_888;
  undefined4 local_884;
  undefined4 local_880;
  undefined4 local_87c;
  undefined4 local_878;
  undefined8 local_870;
  void *local_868;
  int *local_860;
  undefined8 local_858;
  undefined4 local_850;
  long *local_848;
  undefined4 local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined4 local_834;
  undefined4 local_830;
  undefined8 local_828;
  void *local_820;
  int *local_818;
  undefined8 local_810;
  undefined4 local_808;
  long *local_800;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  undefined4 local_7ec;
  undefined4 local_7e8;
  undefined8 local_7e0;
  void *local_7d8;
  int *local_7d0;
  undefined8 local_7c8;
  undefined4 local_7c0;
  long *local_7b8;
  undefined4 local_7b0;
  undefined4 local_7ac;
  undefined4 local_7a8;
  undefined4 local_7a4;
  undefined4 local_7a0;
  undefined8 local_798;
  void *local_790;
  int *local_788;
  undefined8 local_780;
  undefined4 local_778;
  long *local_770;
  undefined4 local_768;
  undefined4 local_764;
  undefined4 local_760;
  undefined4 local_75c;
  undefined4 local_758;
  undefined8 local_750;
  void *local_748;
  int *local_740;
  undefined8 local_738;
  undefined4 local_730;
  long *local_728;
  undefined4 local_720;
  undefined4 local_71c;
  undefined4 local_718;
  undefined4 local_714;
  undefined4 local_710;
  undefined8 local_708;
  void *local_700;
  int *local_6f8;
  undefined8 local_6f0;
  undefined4 local_6e8;
  long *local_6e0;
  undefined4 local_6d8;
  undefined4 local_6d4;
  undefined4 local_6d0;
  undefined4 local_6cc;
  undefined4 local_6c8;
  undefined8 local_6c0;
  void *local_6b8;
  int *local_6b0;
  undefined8 local_6a8;
  undefined4 local_6a0;
  long *local_698;
  undefined4 local_690;
  undefined4 local_68c;
  undefined4 local_688;
  undefined4 local_684;
  undefined4 local_680;
  undefined8 local_678;
  void *local_660;
  int *local_658;
  undefined8 local_650;
  undefined4 local_648;
  long *local_640;
  undefined4 local_638;
  undefined4 local_634;
  undefined4 local_630;
  undefined4 local_62c;
  undefined4 local_628;
  undefined8 local_620;
  int local_614;
  long *local_610;
  int local_5fc;
  void **local_5f8;
  void **local_5e8;
  void **local_5d8;
  void **local_5c8;
  void **local_5b8;
  void **local_5a8;
  void **local_598;
  void **local_588;
  void **local_578;
  void **local_568;
  void **local_558;
  undefined4 **local_548;
  int local_538;
  undefined4 local_534;
  void **local_530;
  void **local_528;
  void **local_520;
  int local_518;
  undefined4 local_514;
  void **local_510;
  void **local_508;
  void **local_500;
  int local_4f8;
  undefined4 local_4f4;
  void **local_4f0;
  void **local_4e8;
  void **local_4e0;
  int local_4d8;
  undefined4 local_4d4;
  void **local_4d0;
  void **local_4c8;
  void **local_4c0;
  int local_4b8;
  undefined4 local_4b4;
  void **local_4b0;
  void **local_4a8;
  void **local_4a0;
  int local_498;
  undefined4 local_494;
  void **local_490;
  void **local_488;
  void **local_480;
  int local_478;
  undefined4 local_474;
  void **local_470;
  void **local_468;
  void **local_460;
  int local_458;
  undefined4 local_454;
  void **local_450;
  void **local_448;
  void **local_440;
  int local_438;
  undefined4 local_434;
  void **local_430;
  void **local_428;
  void **local_420;
  int local_418;
  undefined4 local_414;
  void **local_410;
  void **local_408;
  void **local_400;
  int local_3f8;
  undefined4 local_3f4;
  void **local_3f0;
  void **local_3e8;
  void **local_3e0;
  long *local_3d8;
  long *local_3d0;
  long *local_3c8;
  long *local_3c0;
  long *local_3b8;
  long *local_3b0;
  long *local_3a8;
  long *local_3a0;
  undefined8 local_398;
  undefined4 **local_390;
  int local_388;
  undefined4 local_384;
  void **local_380;
  int local_378;
  undefined4 local_374;
  void **local_370;
  int local_368;
  undefined4 local_364;
  void **local_360;
  int local_358;
  undefined4 local_354;
  void **local_350;
  int local_348;
  undefined4 local_344;
  void **local_340;
  int local_338;
  undefined4 local_334;
  void **local_330;
  int local_328;
  undefined4 local_324;
  void **local_320;
  int local_318;
  undefined4 local_314;
  void **local_310;
  int local_308;
  undefined4 local_304;
  void **local_300;
  int local_2f8;
  undefined4 local_2f4;
  void **local_2f0;
  int local_2e8;
  undefined4 local_2e4;
  void **local_2e0;
  int local_2c8;
  undefined4 local_2c4;
  undefined4 **local_2c0;
  int local_2a8;
  undefined4 local_2a4;
  void **local_2a0;
  int local_288;
  undefined4 local_284;
  void **local_280;
  int local_268;
  undefined4 local_264;
  void **local_260;
  int local_248;
  undefined4 local_244;
  void **local_240;
  int local_228;
  undefined4 local_224;
  void **local_220;
  int local_208;
  undefined4 local_204;
  void **local_200;
  int local_1e8;
  undefined4 local_1e4;
  void **local_1e0;
  int local_1c8;
  undefined4 local_1c4;
  void **local_1c0;
  int local_1a8;
  undefined4 local_1a4;
  void **local_1a0;
  int local_188;
  undefined4 local_184;
  void **local_180;
  int local_168;
  undefined4 local_164;
  void **local_160;
  void *local_98;
  void *local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  void *local_60;
  void *local_58;
  void *local_50;
  void *local_48;
  long *local_40;
  long *local_38;
  long *local_30;
  long *local_28;
  long *local_20;
  long *local_18;
  long *local_10;
  long *local_8;
  
  local_614 = *(int *)(in_RDI + 0xd8) / *(int *)(in_RDI + 0xd0);
  local_610 = in_RSI;
  (**(code **)(*in_RSI + 0x10))(&local_660,in_RSI,*(int *)(in_RDI + 0xd0) * local_614,0);
  ppvVar2 = (void **)(in_RDI + 0xf0);
  local_3f0 = &local_660;
  local_3e8 = ppvVar2;
  if (ppvVar2 != local_3f0) {
    if (local_658 != (int *)0x0) {
      local_3f4 = 1;
      LOCK();
      local_3f8 = *local_658;
      *local_658 = *local_658 + 1;
      UNLOCK();
    }
    local_380 = ppvVar2;
    if (*(long *)(in_RDI + 0xf8) != 0) {
      piVar1 = *(int **)(in_RDI + 0xf8);
      local_384 = 0xffffffff;
      LOCK();
      local_388 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_388 == 1) {
        if (*(long *)(in_RDI + 0x110) == 0) {
          local_48 = *ppvVar2;
          if (local_48 != (void *)0x0) {
            free(local_48);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x110) + 0x18))(*(long **)(in_RDI + 0x110),*ppvVar2);
        }
      }
    }
    *ppvVar2 = (void *)0x0;
    *(undefined8 *)(in_RDI + 0x100) = 0;
    *(undefined4 *)(in_RDI + 0x108) = 0;
    *(undefined4 *)(in_RDI + 0x118) = 0;
    *(undefined4 *)(in_RDI + 0x11c) = 0;
    *(undefined4 *)(in_RDI + 0x120) = 0;
    *(undefined4 *)(in_RDI + 0x124) = 0;
    *(undefined4 *)(in_RDI + 0x128) = 0;
    *(undefined8 *)(in_RDI + 0x130) = 0;
    *(undefined8 *)(in_RDI + 0xf8) = 0;
    *ppvVar2 = *local_3f0;
    *(void **)(in_RDI + 0xf8) = local_3f0[1];
    *(void **)(in_RDI + 0x100) = local_3f0[2];
    *(undefined4 *)(in_RDI + 0x108) = *(undefined4 *)(local_3f0 + 3);
    *(void **)(in_RDI + 0x110) = local_3f0[4];
    *(undefined4 *)(in_RDI + 0x118) = *(undefined4 *)(local_3f0 + 5);
    *(undefined4 *)(in_RDI + 0x11c) = *(undefined4 *)((long)local_3f0 + 0x2c);
    *(undefined4 *)(in_RDI + 0x120) = *(undefined4 *)(local_3f0 + 6);
    *(undefined4 *)(in_RDI + 0x124) = *(undefined4 *)((long)local_3f0 + 0x34);
    *(undefined4 *)(in_RDI + 0x128) = *(undefined4 *)(local_3f0 + 7);
    *(void **)(in_RDI + 0x130) = local_3f0[8];
  }
  local_5f8 = &local_660;
  local_3e0 = ppvVar2;
  local_160 = local_5f8;
  if (local_658 != (int *)0x0) {
    local_164 = 0xffffffff;
    LOCK();
    local_168 = *local_658;
    *local_658 = *local_658 + -1;
    UNLOCK();
    if (local_168 == 1) {
      if (local_640 == (long *)0x0) {
        if (local_660 != (void *)0x0) {
          free(local_660);
        }
      }
      else {
        (**(code **)(*local_640 + 0x18))(local_640,local_660);
      }
    }
  }
  local_660 = (void *)0x0;
  local_650 = 0;
  local_648 = 0;
  local_638 = 0;
  local_634 = 0;
  local_630 = 0;
  local_62c = 0;
  local_628 = 0;
  local_620 = 0;
  local_658 = (int *)0x0;
  local_3a0 = (long *)(in_RDI + 0xf0);
  bVar3 = true;
  if (*local_3a0 != 0) {
    bVar3 = *(long *)(in_RDI + 0x130) * (long)*(int *)(in_RDI + 0x128) == 0;
    local_40 = local_3a0;
  }
  if (bVar3) {
    local_5fc = -100;
  }
  else {
    (**(code **)(*local_610 + 0x10))(&local_6b8,local_610,*(undefined4 *)(in_RDI + 0xd0),1);
    ppvVar2 = (void **)(in_RDI + 0x138);
    local_410 = &local_6b8;
    local_408 = ppvVar2;
    if (ppvVar2 != local_410) {
      if (local_6b0 != (int *)0x0) {
        local_414 = 1;
        LOCK();
        local_418 = *local_6b0;
        *local_6b0 = *local_6b0 + 1;
        UNLOCK();
      }
      local_370 = ppvVar2;
      if (*(long *)(in_RDI + 0x140) != 0) {
        piVar1 = *(int **)(in_RDI + 0x140);
        local_374 = 0xffffffff;
        LOCK();
        local_378 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_378 == 1) {
          if (*(long *)(in_RDI + 0x158) == 0) {
            local_50 = *ppvVar2;
            if (local_50 != (void *)0x0) {
              free(local_50);
            }
          }
          else {
            (**(code **)(**(long **)(in_RDI + 0x158) + 0x18))(*(long **)(in_RDI + 0x158),*ppvVar2);
          }
        }
      }
      *ppvVar2 = (void *)0x0;
      *(undefined8 *)(in_RDI + 0x148) = 0;
      *(undefined4 *)(in_RDI + 0x150) = 0;
      *(undefined4 *)(in_RDI + 0x160) = 0;
      *(undefined4 *)(in_RDI + 0x164) = 0;
      *(undefined4 *)(in_RDI + 0x168) = 0;
      *(undefined4 *)(in_RDI + 0x16c) = 0;
      *(undefined4 *)(in_RDI + 0x170) = 0;
      *(undefined8 *)(in_RDI + 0x178) = 0;
      *(undefined8 *)(in_RDI + 0x140) = 0;
      *ppvVar2 = *local_410;
      *(void **)(in_RDI + 0x140) = local_410[1];
      *(void **)(in_RDI + 0x148) = local_410[2];
      *(undefined4 *)(in_RDI + 0x150) = *(undefined4 *)(local_410 + 3);
      *(void **)(in_RDI + 0x158) = local_410[4];
      *(undefined4 *)(in_RDI + 0x160) = *(undefined4 *)(local_410 + 5);
      *(undefined4 *)(in_RDI + 0x164) = *(undefined4 *)((long)local_410 + 0x2c);
      *(undefined4 *)(in_RDI + 0x168) = *(undefined4 *)(local_410 + 6);
      *(undefined4 *)(in_RDI + 0x16c) = *(undefined4 *)((long)local_410 + 0x34);
      *(undefined4 *)(in_RDI + 0x170) = *(undefined4 *)(local_410 + 7);
      *(void **)(in_RDI + 0x178) = local_410[8];
    }
    local_5e8 = &local_6b8;
    local_400 = ppvVar2;
    local_180 = local_5e8;
    if (local_6b0 != (int *)0x0) {
      local_184 = 0xffffffff;
      LOCK();
      local_188 = *local_6b0;
      *local_6b0 = *local_6b0 + -1;
      UNLOCK();
      if (local_188 == 1) {
        if (local_698 == (long *)0x0) {
          if (local_6b8 != (void *)0x0) {
            free(local_6b8);
          }
        }
        else {
          (**(code **)(*local_698 + 0x18))(local_698,local_6b8);
        }
      }
    }
    local_6b8 = (void *)0x0;
    local_6a8 = 0;
    local_6a0 = 0;
    local_690 = 0;
    local_68c = 0;
    local_688 = 0;
    local_684 = 0;
    local_680 = 0;
    local_678 = 0;
    local_6b0 = (int *)0x0;
    local_3a8 = (long *)(in_RDI + 0x138);
    bVar3 = true;
    if (*local_3a8 != 0) {
      bVar3 = *(long *)(in_RDI + 0x178) * (long)*(int *)(in_RDI + 0x170) == 0;
      local_38 = local_3a8;
    }
    if (bVar3) {
      local_5fc = -100;
    }
    else {
      (**(code **)(*local_610 + 0x10))
                (&local_700,local_610,*(int *)(in_RDI + 0xd0) * *(int *)(in_RDI + 0xdc),0);
      ppvVar2 = (void **)(in_RDI + 0x180);
      local_430 = &local_700;
      local_428 = ppvVar2;
      if (ppvVar2 != local_430) {
        if (local_6f8 != (int *)0x0) {
          local_434 = 1;
          LOCK();
          local_438 = *local_6f8;
          *local_6f8 = *local_6f8 + 1;
          UNLOCK();
        }
        local_360 = ppvVar2;
        if (*(long *)(in_RDI + 0x188) != 0) {
          piVar1 = *(int **)(in_RDI + 0x188);
          local_364 = 0xffffffff;
          LOCK();
          local_368 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_368 == 1) {
            if (*(long *)(in_RDI + 0x1a0) == 0) {
              local_58 = *ppvVar2;
              if (local_58 != (void *)0x0) {
                free(local_58);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x1a0) + 0x18))(*(long **)(in_RDI + 0x1a0),*ppvVar2)
              ;
            }
          }
        }
        *ppvVar2 = (void *)0x0;
        *(undefined8 *)(in_RDI + 400) = 0;
        *(undefined4 *)(in_RDI + 0x198) = 0;
        *(undefined4 *)(in_RDI + 0x1a8) = 0;
        *(undefined4 *)(in_RDI + 0x1ac) = 0;
        *(undefined4 *)(in_RDI + 0x1b0) = 0;
        *(undefined4 *)(in_RDI + 0x1b4) = 0;
        *(undefined4 *)(in_RDI + 0x1b8) = 0;
        *(undefined8 *)(in_RDI + 0x1c0) = 0;
        *(undefined8 *)(in_RDI + 0x188) = 0;
        *ppvVar2 = *local_430;
        *(void **)(in_RDI + 0x188) = local_430[1];
        *(void **)(in_RDI + 400) = local_430[2];
        *(undefined4 *)(in_RDI + 0x198) = *(undefined4 *)(local_430 + 3);
        *(void **)(in_RDI + 0x1a0) = local_430[4];
        *(undefined4 *)(in_RDI + 0x1a8) = *(undefined4 *)(local_430 + 5);
        *(undefined4 *)(in_RDI + 0x1ac) = *(undefined4 *)((long)local_430 + 0x2c);
        *(undefined4 *)(in_RDI + 0x1b0) = *(undefined4 *)(local_430 + 6);
        *(undefined4 *)(in_RDI + 0x1b4) = *(undefined4 *)((long)local_430 + 0x34);
        *(undefined4 *)(in_RDI + 0x1b8) = *(undefined4 *)(local_430 + 7);
        *(void **)(in_RDI + 0x1c0) = local_430[8];
      }
      local_5d8 = &local_700;
      local_420 = ppvVar2;
      local_1a0 = local_5d8;
      if (local_6f8 != (int *)0x0) {
        local_1a4 = 0xffffffff;
        LOCK();
        local_1a8 = *local_6f8;
        *local_6f8 = *local_6f8 + -1;
        UNLOCK();
        if (local_1a8 == 1) {
          if (local_6e0 == (long *)0x0) {
            if (local_700 != (void *)0x0) {
              free(local_700);
            }
          }
          else {
            (**(code **)(*local_6e0 + 0x18))(local_6e0,local_700);
          }
        }
      }
      local_700 = (void *)0x0;
      local_6f0 = 0;
      local_6e8 = 0;
      local_6d8 = 0;
      local_6d4 = 0;
      local_6d0 = 0;
      local_6cc = 0;
      local_6c8 = 0;
      local_6c0 = 0;
      local_6f8 = (int *)0x0;
      local_3b0 = (long *)(in_RDI + 0x180);
      bVar3 = true;
      if (*local_3b0 != 0) {
        bVar3 = *(long *)(in_RDI + 0x1c0) * (long)*(int *)(in_RDI + 0x1b8) == 0;
        local_30 = local_3b0;
      }
      if (bVar3) {
        local_5fc = -100;
      }
      else {
        (**(code **)(*local_610 + 0x10))(&local_748,local_610,*(undefined4 *)(in_RDI + 0xd0),1);
        ppvVar2 = (void **)(in_RDI + 0x1c8);
        local_450 = &local_748;
        local_448 = ppvVar2;
        if (ppvVar2 != local_450) {
          if (local_740 != (int *)0x0) {
            local_454 = 1;
            LOCK();
            local_458 = *local_740;
            *local_740 = *local_740 + 1;
            UNLOCK();
          }
          local_350 = ppvVar2;
          if (*(long *)(in_RDI + 0x1d0) != 0) {
            piVar1 = *(int **)(in_RDI + 0x1d0);
            local_354 = 0xffffffff;
            LOCK();
            local_358 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_358 == 1) {
              if (*(long *)(in_RDI + 0x1e8) == 0) {
                local_60 = *ppvVar2;
                if (local_60 != (void *)0x0) {
                  free(local_60);
                }
              }
              else {
                (**(code **)(**(long **)(in_RDI + 0x1e8) + 0x18))
                          (*(long **)(in_RDI + 0x1e8),*ppvVar2);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          *(undefined8 *)(in_RDI + 0x1d8) = 0;
          *(undefined4 *)(in_RDI + 0x1e0) = 0;
          *(undefined4 *)(in_RDI + 0x1f0) = 0;
          *(undefined4 *)(in_RDI + 500) = 0;
          *(undefined4 *)(in_RDI + 0x1f8) = 0;
          *(undefined4 *)(in_RDI + 0x1fc) = 0;
          *(undefined4 *)(in_RDI + 0x200) = 0;
          *(undefined8 *)(in_RDI + 0x208) = 0;
          *(undefined8 *)(in_RDI + 0x1d0) = 0;
          *ppvVar2 = *local_450;
          *(void **)(in_RDI + 0x1d0) = local_450[1];
          *(void **)(in_RDI + 0x1d8) = local_450[2];
          *(undefined4 *)(in_RDI + 0x1e0) = *(undefined4 *)(local_450 + 3);
          *(void **)(in_RDI + 0x1e8) = local_450[4];
          *(undefined4 *)(in_RDI + 0x1f0) = *(undefined4 *)(local_450 + 5);
          *(undefined4 *)(in_RDI + 500) = *(undefined4 *)((long)local_450 + 0x2c);
          *(undefined4 *)(in_RDI + 0x1f8) = *(undefined4 *)(local_450 + 6);
          *(undefined4 *)(in_RDI + 0x1fc) = *(undefined4 *)((long)local_450 + 0x34);
          *(undefined4 *)(in_RDI + 0x200) = *(undefined4 *)(local_450 + 7);
          *(void **)(in_RDI + 0x208) = local_450[8];
        }
        local_5c8 = &local_748;
        local_440 = ppvVar2;
        local_1c0 = local_5c8;
        if (local_740 != (int *)0x0) {
          local_1c4 = 0xffffffff;
          LOCK();
          local_1c8 = *local_740;
          *local_740 = *local_740 + -1;
          UNLOCK();
          if (local_1c8 == 1) {
            if (local_728 == (long *)0x0) {
              if (local_748 != (void *)0x0) {
                free(local_748);
              }
            }
            else {
              (**(code **)(*local_728 + 0x18))(local_728,local_748);
            }
          }
        }
        local_748 = (void *)0x0;
        local_738 = 0;
        local_730 = 0;
        local_720 = 0;
        local_71c = 0;
        local_718 = 0;
        local_714 = 0;
        local_710 = 0;
        local_708 = 0;
        local_740 = (int *)0x0;
        local_3b8 = (long *)(in_RDI + 0x1c8);
        bVar3 = true;
        if (*local_3b8 != 0) {
          bVar3 = *(long *)(in_RDI + 0x208) * (long)*(int *)(in_RDI + 0x200) == 0;
          local_28 = local_3b8;
        }
        if (bVar3) {
          local_5fc = -100;
        }
        else {
          (**(code **)(*local_610 + 0x10))
                    (&local_790,local_610,*(int *)(in_RDI + 0xd0) * *(int *)(in_RDI + 0xe0),0);
          ppvVar2 = (void **)(in_RDI + 0x210);
          local_470 = &local_790;
          local_468 = ppvVar2;
          if (ppvVar2 != local_470) {
            if (local_788 != (int *)0x0) {
              local_474 = 1;
              LOCK();
              local_478 = *local_788;
              *local_788 = *local_788 + 1;
              UNLOCK();
            }
            local_340 = ppvVar2;
            if (*(long *)(in_RDI + 0x218) != 0) {
              piVar1 = *(int **)(in_RDI + 0x218);
              local_344 = 0xffffffff;
              LOCK();
              local_348 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_348 == 1) {
                if (*(long *)(in_RDI + 0x230) == 0) {
                  local_68 = *ppvVar2;
                  if (local_68 != (void *)0x0) {
                    free(local_68);
                  }
                }
                else {
                  (**(code **)(**(long **)(in_RDI + 0x230) + 0x18))
                            (*(long **)(in_RDI + 0x230),*ppvVar2);
                }
              }
            }
            *ppvVar2 = (void *)0x0;
            *(undefined8 *)(in_RDI + 0x220) = 0;
            *(undefined4 *)(in_RDI + 0x228) = 0;
            *(undefined4 *)(in_RDI + 0x238) = 0;
            *(undefined4 *)(in_RDI + 0x23c) = 0;
            *(undefined4 *)(in_RDI + 0x240) = 0;
            *(undefined4 *)(in_RDI + 0x244) = 0;
            *(undefined4 *)(in_RDI + 0x248) = 0;
            *(undefined8 *)(in_RDI + 0x250) = 0;
            *(undefined8 *)(in_RDI + 0x218) = 0;
            *ppvVar2 = *local_470;
            *(void **)(in_RDI + 0x218) = local_470[1];
            *(void **)(in_RDI + 0x220) = local_470[2];
            *(undefined4 *)(in_RDI + 0x228) = *(undefined4 *)(local_470 + 3);
            *(void **)(in_RDI + 0x230) = local_470[4];
            *(undefined4 *)(in_RDI + 0x238) = *(undefined4 *)(local_470 + 5);
            *(undefined4 *)(in_RDI + 0x23c) = *(undefined4 *)((long)local_470 + 0x2c);
            *(undefined4 *)(in_RDI + 0x240) = *(undefined4 *)(local_470 + 6);
            *(undefined4 *)(in_RDI + 0x244) = *(undefined4 *)((long)local_470 + 0x34);
            *(undefined4 *)(in_RDI + 0x248) = *(undefined4 *)(local_470 + 7);
            *(void **)(in_RDI + 0x250) = local_470[8];
          }
          local_5b8 = &local_790;
          local_460 = ppvVar2;
          local_1e0 = local_5b8;
          if (local_788 != (int *)0x0) {
            local_1e4 = 0xffffffff;
            LOCK();
            local_1e8 = *local_788;
            *local_788 = *local_788 + -1;
            UNLOCK();
            if (local_1e8 == 1) {
              if (local_770 == (long *)0x0) {
                if (local_790 != (void *)0x0) {
                  free(local_790);
                }
              }
              else {
                (**(code **)(*local_770 + 0x18))(local_770,local_790);
              }
            }
          }
          local_790 = (void *)0x0;
          local_780 = 0;
          local_778 = 0;
          local_768 = 0;
          local_764 = 0;
          local_760 = 0;
          local_75c = 0;
          local_758 = 0;
          local_750 = 0;
          local_788 = (int *)0x0;
          local_3c0 = (long *)(in_RDI + 0x210);
          bVar3 = true;
          if (*local_3c0 != 0) {
            bVar3 = *(long *)(in_RDI + 0x250) * (long)*(int *)(in_RDI + 0x248) == 0;
            local_20 = local_3c0;
          }
          if (bVar3) {
            local_5fc = -100;
          }
          else {
            (**(code **)(*local_610 + 0x10))(&local_7d8,local_610,*(undefined4 *)(in_RDI + 0xd0),1);
            ppvVar2 = (void **)(in_RDI + 600);
            local_490 = &local_7d8;
            local_488 = ppvVar2;
            if (ppvVar2 != local_490) {
              if (local_7d0 != (int *)0x0) {
                local_494 = 1;
                LOCK();
                local_498 = *local_7d0;
                *local_7d0 = *local_7d0 + 1;
                UNLOCK();
              }
              local_330 = ppvVar2;
              if (*(long *)(in_RDI + 0x260) != 0) {
                piVar1 = *(int **)(in_RDI + 0x260);
                local_334 = 0xffffffff;
                LOCK();
                local_338 = *piVar1;
                *piVar1 = *piVar1 + -1;
                UNLOCK();
                if (local_338 == 1) {
                  if (*(long *)(in_RDI + 0x278) == 0) {
                    local_70 = *ppvVar2;
                    if (local_70 != (void *)0x0) {
                      free(local_70);
                    }
                  }
                  else {
                    (**(code **)(**(long **)(in_RDI + 0x278) + 0x18))
                              (*(long **)(in_RDI + 0x278),*ppvVar2);
                  }
                }
              }
              *ppvVar2 = (void *)0x0;
              *(undefined8 *)(in_RDI + 0x268) = 0;
              *(undefined4 *)(in_RDI + 0x270) = 0;
              *(undefined4 *)(in_RDI + 0x280) = 0;
              *(undefined4 *)(in_RDI + 0x284) = 0;
              *(undefined4 *)(in_RDI + 0x288) = 0;
              *(undefined4 *)(in_RDI + 0x28c) = 0;
              *(undefined4 *)(in_RDI + 0x290) = 0;
              *(undefined8 *)(in_RDI + 0x298) = 0;
              *(undefined8 *)(in_RDI + 0x260) = 0;
              *ppvVar2 = *local_490;
              *(void **)(in_RDI + 0x260) = local_490[1];
              *(void **)(in_RDI + 0x268) = local_490[2];
              *(undefined4 *)(in_RDI + 0x270) = *(undefined4 *)(local_490 + 3);
              *(void **)(in_RDI + 0x278) = local_490[4];
              *(undefined4 *)(in_RDI + 0x280) = *(undefined4 *)(local_490 + 5);
              *(undefined4 *)(in_RDI + 0x284) = *(undefined4 *)((long)local_490 + 0x2c);
              *(undefined4 *)(in_RDI + 0x288) = *(undefined4 *)(local_490 + 6);
              *(undefined4 *)(in_RDI + 0x28c) = *(undefined4 *)((long)local_490 + 0x34);
              *(undefined4 *)(in_RDI + 0x290) = *(undefined4 *)(local_490 + 7);
              *(void **)(in_RDI + 0x298) = local_490[8];
            }
            local_5a8 = &local_7d8;
            local_480 = ppvVar2;
            local_200 = local_5a8;
            if (local_7d0 != (int *)0x0) {
              local_204 = 0xffffffff;
              LOCK();
              local_208 = *local_7d0;
              *local_7d0 = *local_7d0 + -1;
              UNLOCK();
              if (local_208 == 1) {
                if (local_7b8 == (long *)0x0) {
                  if (local_7d8 != (void *)0x0) {
                    free(local_7d8);
                  }
                }
                else {
                  (**(code **)(*local_7b8 + 0x18))(local_7b8,local_7d8);
                }
              }
            }
            local_7d8 = (void *)0x0;
            local_7c8 = 0;
            local_7c0 = 0;
            local_7b0 = 0;
            local_7ac = 0;
            local_7a8 = 0;
            local_7a4 = 0;
            local_7a0 = 0;
            local_798 = 0;
            local_7d0 = (int *)0x0;
            local_3c8 = (long *)(in_RDI + 600);
            bVar3 = true;
            if (*local_3c8 != 0) {
              bVar3 = *(long *)(in_RDI + 0x298) * (long)*(int *)(in_RDI + 0x290) == 0;
              local_18 = local_3c8;
            }
            if (bVar3) {
              local_5fc = -100;
            }
            else {
              (**(code **)(*local_610 + 0x10))
                        (&local_820,local_610,local_614 * *(int *)(in_RDI + 0xd0),0);
              ppvVar2 = (void **)(in_RDI + 0x2a0);
              local_4b0 = &local_820;
              local_4a8 = ppvVar2;
              if (ppvVar2 != local_4b0) {
                if (local_818 != (int *)0x0) {
                  local_4b4 = 1;
                  LOCK();
                  local_4b8 = *local_818;
                  *local_818 = *local_818 + 1;
                  UNLOCK();
                }
                local_320 = ppvVar2;
                if (*(long *)(in_RDI + 0x2a8) != 0) {
                  piVar1 = *(int **)(in_RDI + 0x2a8);
                  local_324 = 0xffffffff;
                  LOCK();
                  local_328 = *piVar1;
                  *piVar1 = *piVar1 + -1;
                  UNLOCK();
                  if (local_328 == 1) {
                    if (*(long *)(in_RDI + 0x2c0) == 0) {
                      local_78 = *ppvVar2;
                      if (local_78 != (void *)0x0) {
                        free(local_78);
                      }
                    }
                    else {
                      (**(code **)(**(long **)(in_RDI + 0x2c0) + 0x18))
                                (*(long **)(in_RDI + 0x2c0),*ppvVar2);
                    }
                  }
                }
                *ppvVar2 = (void *)0x0;
                *(undefined8 *)(in_RDI + 0x2b0) = 0;
                *(undefined4 *)(in_RDI + 0x2b8) = 0;
                *(undefined4 *)(in_RDI + 0x2c8) = 0;
                *(undefined4 *)(in_RDI + 0x2cc) = 0;
                *(undefined4 *)(in_RDI + 0x2d0) = 0;
                *(undefined4 *)(in_RDI + 0x2d4) = 0;
                *(undefined4 *)(in_RDI + 0x2d8) = 0;
                *(undefined8 *)(in_RDI + 0x2e0) = 0;
                *(undefined8 *)(in_RDI + 0x2a8) = 0;
                *ppvVar2 = *local_4b0;
                *(void **)(in_RDI + 0x2a8) = local_4b0[1];
                *(void **)(in_RDI + 0x2b0) = local_4b0[2];
                *(undefined4 *)(in_RDI + 0x2b8) = *(undefined4 *)(local_4b0 + 3);
                *(void **)(in_RDI + 0x2c0) = local_4b0[4];
                *(undefined4 *)(in_RDI + 0x2c8) = *(undefined4 *)(local_4b0 + 5);
                *(undefined4 *)(in_RDI + 0x2cc) = *(undefined4 *)((long)local_4b0 + 0x2c);
                *(undefined4 *)(in_RDI + 0x2d0) = *(undefined4 *)(local_4b0 + 6);
                *(undefined4 *)(in_RDI + 0x2d4) = *(undefined4 *)((long)local_4b0 + 0x34);
                *(undefined4 *)(in_RDI + 0x2d8) = *(undefined4 *)(local_4b0 + 7);
                *(void **)(in_RDI + 0x2e0) = local_4b0[8];
              }
              local_598 = &local_820;
              local_4a0 = ppvVar2;
              local_220 = local_598;
              if (local_818 != (int *)0x0) {
                local_224 = 0xffffffff;
                LOCK();
                local_228 = *local_818;
                *local_818 = *local_818 + -1;
                UNLOCK();
                if (local_228 == 1) {
                  if (local_800 == (long *)0x0) {
                    if (local_820 != (void *)0x0) {
                      free(local_820);
                    }
                  }
                  else {
                    (**(code **)(*local_800 + 0x18))(local_800,local_820);
                  }
                }
              }
              local_820 = (void *)0x0;
              local_810 = 0;
              local_808 = 0;
              local_7f8 = 0;
              local_7f4 = 0;
              local_7f0 = 0;
              local_7ec = 0;
              local_7e8 = 0;
              local_7e0 = 0;
              local_818 = (int *)0x0;
              local_3d0 = (long *)(in_RDI + 0x2a0);
              bVar3 = true;
              if (*local_3d0 != 0) {
                bVar3 = *(long *)(in_RDI + 0x2e0) * (long)*(int *)(in_RDI + 0x2d8) == 0;
                local_10 = local_3d0;
              }
              if (bVar3) {
                local_5fc = -100;
              }
              else {
                (**(code **)(*local_610 + 0x10))(&local_868,local_610,local_614,1);
                ppvVar2 = (void **)(in_RDI + 0x2e8);
                local_4d0 = &local_868;
                local_4c8 = ppvVar2;
                if (ppvVar2 != local_4d0) {
                  if (local_860 != (int *)0x0) {
                    local_4d4 = 1;
                    LOCK();
                    local_4d8 = *local_860;
                    *local_860 = *local_860 + 1;
                    UNLOCK();
                  }
                  local_310 = ppvVar2;
                  if (*(long *)(in_RDI + 0x2f0) != 0) {
                    piVar1 = *(int **)(in_RDI + 0x2f0);
                    local_314 = 0xffffffff;
                    LOCK();
                    local_318 = *piVar1;
                    *piVar1 = *piVar1 + -1;
                    UNLOCK();
                    if (local_318 == 1) {
                      if (*(long *)(in_RDI + 0x308) == 0) {
                        local_80 = *ppvVar2;
                        if (local_80 != (void *)0x0) {
                          free(local_80);
                        }
                      }
                      else {
                        (**(code **)(**(long **)(in_RDI + 0x308) + 0x18))
                                  (*(long **)(in_RDI + 0x308),*ppvVar2);
                      }
                    }
                  }
                  *ppvVar2 = (void *)0x0;
                  *(undefined8 *)(in_RDI + 0x2f8) = 0;
                  *(undefined4 *)(in_RDI + 0x300) = 0;
                  *(undefined4 *)(in_RDI + 0x310) = 0;
                  *(undefined4 *)(in_RDI + 0x314) = 0;
                  *(undefined4 *)(in_RDI + 0x318) = 0;
                  *(undefined4 *)(in_RDI + 0x31c) = 0;
                  *(undefined4 *)(in_RDI + 800) = 0;
                  *(undefined8 *)(in_RDI + 0x328) = 0;
                  *(undefined8 *)(in_RDI + 0x2f0) = 0;
                  *ppvVar2 = *local_4d0;
                  *(void **)(in_RDI + 0x2f0) = local_4d0[1];
                  *(void **)(in_RDI + 0x2f8) = local_4d0[2];
                  *(undefined4 *)(in_RDI + 0x300) = *(undefined4 *)(local_4d0 + 3);
                  *(void **)(in_RDI + 0x308) = local_4d0[4];
                  *(undefined4 *)(in_RDI + 0x310) = *(undefined4 *)(local_4d0 + 5);
                  *(undefined4 *)(in_RDI + 0x314) = *(undefined4 *)((long)local_4d0 + 0x2c);
                  *(undefined4 *)(in_RDI + 0x318) = *(undefined4 *)(local_4d0 + 6);
                  *(undefined4 *)(in_RDI + 0x31c) = *(undefined4 *)((long)local_4d0 + 0x34);
                  *(undefined4 *)(in_RDI + 800) = *(undefined4 *)(local_4d0 + 7);
                  *(void **)(in_RDI + 0x328) = local_4d0[8];
                }
                local_588 = &local_868;
                local_4c0 = ppvVar2;
                local_240 = local_588;
                if (local_860 != (int *)0x0) {
                  local_244 = 0xffffffff;
                  LOCK();
                  local_248 = *local_860;
                  *local_860 = *local_860 + -1;
                  UNLOCK();
                  if (local_248 == 1) {
                    if (local_848 == (long *)0x0) {
                      if (local_868 != (void *)0x0) {
                        free(local_868);
                      }
                    }
                    else {
                      (**(code **)(*local_848 + 0x18))(local_848,local_868);
                    }
                  }
                }
                local_868 = (void *)0x0;
                local_858 = 0;
                local_850 = 0;
                local_840 = 0;
                local_83c = 0;
                local_838 = 0;
                local_834 = 0;
                local_830 = 0;
                local_828 = 0;
                local_860 = (int *)0x0;
                local_3d8 = (long *)(in_RDI + 0x2e8);
                bVar3 = true;
                if (*local_3d8 != 0) {
                  bVar3 = *(long *)(in_RDI + 0x328) * (long)*(int *)(in_RDI + 800) == 0;
                  local_8 = local_3d8;
                }
                if (bVar3) {
                  local_5fc = -100;
                }
                else {
                  if (*(int *)(in_RDI + 0xec) != 0) {
                    (**(code **)(*local_610 + 0x10))
                              (&local_8b0,local_610,*(undefined4 *)(in_RDI + 0xd0),1);
                    ppvVar2 = (void **)(in_RDI + 0x330);
                    local_4f0 = &local_8b0;
                    local_4e8 = ppvVar2;
                    if (ppvVar2 != local_4f0) {
                      if (local_8a8 != (int *)0x0) {
                        local_4f4 = 1;
                        LOCK();
                        local_4f8 = *local_8a8;
                        *local_8a8 = *local_8a8 + 1;
                        UNLOCK();
                      }
                      local_300 = ppvVar2;
                      if (*(long *)(in_RDI + 0x338) != 0) {
                        piVar1 = *(int **)(in_RDI + 0x338);
                        local_304 = 0xffffffff;
                        LOCK();
                        local_308 = *piVar1;
                        *piVar1 = *piVar1 + -1;
                        UNLOCK();
                        if (local_308 == 1) {
                          if (*(long *)(in_RDI + 0x350) == 0) {
                            local_88 = *ppvVar2;
                            if (local_88 != (void *)0x0) {
                              free(local_88);
                            }
                          }
                          else {
                            (**(code **)(**(long **)(in_RDI + 0x350) + 0x18))
                                      (*(long **)(in_RDI + 0x350),*ppvVar2);
                          }
                        }
                      }
                      *ppvVar2 = (void *)0x0;
                      *(undefined8 *)(in_RDI + 0x340) = 0;
                      *(undefined4 *)(in_RDI + 0x348) = 0;
                      *(undefined4 *)(in_RDI + 0x358) = 0;
                      *(undefined4 *)(in_RDI + 0x35c) = 0;
                      *(undefined4 *)(in_RDI + 0x360) = 0;
                      *(undefined4 *)(in_RDI + 0x364) = 0;
                      *(undefined4 *)(in_RDI + 0x368) = 0;
                      *(undefined8 *)(in_RDI + 0x370) = 0;
                      *(undefined8 *)(in_RDI + 0x338) = 0;
                      *ppvVar2 = *local_4f0;
                      *(void **)(in_RDI + 0x338) = local_4f0[1];
                      *(void **)(in_RDI + 0x340) = local_4f0[2];
                      *(undefined4 *)(in_RDI + 0x348) = *(undefined4 *)(local_4f0 + 3);
                      *(void **)(in_RDI + 0x350) = local_4f0[4];
                      *(undefined4 *)(in_RDI + 0x358) = *(undefined4 *)(local_4f0 + 5);
                      *(undefined4 *)(in_RDI + 0x35c) = *(undefined4 *)((long)local_4f0 + 0x2c);
                      *(undefined4 *)(in_RDI + 0x360) = *(undefined4 *)(local_4f0 + 6);
                      *(undefined4 *)(in_RDI + 0x364) = *(undefined4 *)((long)local_4f0 + 0x34);
                      *(undefined4 *)(in_RDI + 0x368) = *(undefined4 *)(local_4f0 + 7);
                      *(void **)(in_RDI + 0x370) = local_4f0[8];
                    }
                    local_578 = &local_8b0;
                    local_4e0 = ppvVar2;
                    local_260 = local_578;
                    if (local_8a8 != (int *)0x0) {
                      local_264 = 0xffffffff;
                      LOCK();
                      local_268 = *local_8a8;
                      *local_8a8 = *local_8a8 + -1;
                      UNLOCK();
                      if (local_268 == 1) {
                        if (local_890 == (long *)0x0) {
                          if (local_8b0 != (void *)0x0) {
                            free(local_8b0);
                          }
                        }
                        else {
                          (**(code **)(*local_890 + 0x18))(local_890,local_8b0);
                        }
                      }
                    }
                    local_8b0 = (void *)0x0;
                    local_8a0 = 0;
                    local_898 = 0;
                    local_888 = 0;
                    local_884 = 0;
                    local_880 = 0;
                    local_87c = 0;
                    local_878 = 0;
                    local_870 = 0;
                    local_8a8 = (int *)0x0;
                    (**(code **)(*local_610 + 0x10))
                              (&local_8f8,local_610,*(undefined4 *)(in_RDI + 0xd0),1);
                    ppvVar2 = (void **)(in_RDI + 0x378);
                    local_510 = &local_8f8;
                    local_508 = ppvVar2;
                    if (ppvVar2 != local_510) {
                      if (local_8f0 != (int *)0x0) {
                        local_514 = 1;
                        LOCK();
                        local_518 = *local_8f0;
                        *local_8f0 = *local_8f0 + 1;
                        UNLOCK();
                      }
                      local_2f0 = ppvVar2;
                      if (*(long *)(in_RDI + 0x380) != 0) {
                        piVar1 = *(int **)(in_RDI + 0x380);
                        local_2f4 = 0xffffffff;
                        LOCK();
                        local_2f8 = *piVar1;
                        *piVar1 = *piVar1 + -1;
                        UNLOCK();
                        if (local_2f8 == 1) {
                          if (*(long *)(in_RDI + 0x398) == 0) {
                            local_90 = *ppvVar2;
                            if (local_90 != (void *)0x0) {
                              free(local_90);
                            }
                          }
                          else {
                            (**(code **)(**(long **)(in_RDI + 0x398) + 0x18))
                                      (*(long **)(in_RDI + 0x398),*ppvVar2);
                          }
                        }
                      }
                      *ppvVar2 = (void *)0x0;
                      *(undefined8 *)(in_RDI + 0x388) = 0;
                      *(undefined4 *)(in_RDI + 0x390) = 0;
                      *(undefined4 *)(in_RDI + 0x3a0) = 0;
                      *(undefined4 *)(in_RDI + 0x3a4) = 0;
                      *(undefined4 *)(in_RDI + 0x3a8) = 0;
                      *(undefined4 *)(in_RDI + 0x3ac) = 0;
                      *(undefined4 *)(in_RDI + 0x3b0) = 0;
                      *(undefined8 *)(in_RDI + 0x3b8) = 0;
                      *(undefined8 *)(in_RDI + 0x380) = 0;
                      *ppvVar2 = *local_510;
                      *(void **)(in_RDI + 0x380) = local_510[1];
                      *(void **)(in_RDI + 0x388) = local_510[2];
                      *(undefined4 *)(in_RDI + 0x390) = *(undefined4 *)(local_510 + 3);
                      *(void **)(in_RDI + 0x398) = local_510[4];
                      *(undefined4 *)(in_RDI + 0x3a0) = *(undefined4 *)(local_510 + 5);
                      *(undefined4 *)(in_RDI + 0x3a4) = *(undefined4 *)((long)local_510 + 0x2c);
                      *(undefined4 *)(in_RDI + 0x3a8) = *(undefined4 *)(local_510 + 6);
                      *(undefined4 *)(in_RDI + 0x3ac) = *(undefined4 *)((long)local_510 + 0x34);
                      *(undefined4 *)(in_RDI + 0x3b0) = *(undefined4 *)(local_510 + 7);
                      *(void **)(in_RDI + 0x3b8) = local_510[8];
                    }
                    local_568 = &local_8f8;
                    local_500 = ppvVar2;
                    local_280 = local_568;
                    if (local_8f0 != (int *)0x0) {
                      local_284 = 0xffffffff;
                      LOCK();
                      local_288 = *local_8f0;
                      *local_8f0 = *local_8f0 + -1;
                      UNLOCK();
                      if (local_288 == 1) {
                        if (local_8d8 == (long *)0x0) {
                          if (local_8f8 != (void *)0x0) {
                            free(local_8f8);
                          }
                        }
                        else {
                          (**(code **)(*local_8d8 + 0x18))(local_8d8,local_8f8);
                        }
                      }
                    }
                    local_8f8 = (void *)0x0;
                    local_8e8 = 0;
                    local_8e0 = 0;
                    local_8d0 = 0;
                    local_8cc = 0;
                    local_8c8 = 0;
                    local_8c4 = 0;
                    local_8c0 = 0;
                    local_8b8 = 0;
                    local_8f0 = (int *)0x0;
                    (**(code **)(*local_610 + 0x10))
                              (&local_940,local_610,*(undefined4 *)(in_RDI + 0xd0),1);
                    ppvVar2 = (void **)(in_RDI + 0x3c0);
                    local_530 = &local_940;
                    local_528 = ppvVar2;
                    if (ppvVar2 != local_530) {
                      if (local_938 != (int *)0x0) {
                        local_534 = 1;
                        LOCK();
                        local_538 = *local_938;
                        *local_938 = *local_938 + 1;
                        UNLOCK();
                      }
                      local_2e0 = ppvVar2;
                      if (*(long *)(in_RDI + 0x3c8) != 0) {
                        piVar1 = *(int **)(in_RDI + 0x3c8);
                        local_2e4 = 0xffffffff;
                        LOCK();
                        local_2e8 = *piVar1;
                        *piVar1 = *piVar1 + -1;
                        UNLOCK();
                        if (local_2e8 == 1) {
                          if (*(long *)(in_RDI + 0x3e0) == 0) {
                            local_98 = *ppvVar2;
                            if (local_98 != (void *)0x0) {
                              free(local_98);
                            }
                          }
                          else {
                            (**(code **)(**(long **)(in_RDI + 0x3e0) + 0x18))
                                      (*(long **)(in_RDI + 0x3e0),*ppvVar2);
                          }
                        }
                      }
                      *ppvVar2 = (void *)0x0;
                      *(undefined8 *)(in_RDI + 0x3d0) = 0;
                      *(undefined4 *)(in_RDI + 0x3d8) = 0;
                      *(undefined4 *)(in_RDI + 1000) = 0;
                      *(undefined4 *)(in_RDI + 0x3ec) = 0;
                      *(undefined4 *)(in_RDI + 0x3f0) = 0;
                      *(undefined4 *)(in_RDI + 0x3f4) = 0;
                      *(undefined4 *)(in_RDI + 0x3f8) = 0;
                      *(undefined8 *)(in_RDI + 0x400) = 0;
                      *(undefined8 *)(in_RDI + 0x3c8) = 0;
                      *ppvVar2 = *local_530;
                      *(void **)(in_RDI + 0x3c8) = local_530[1];
                      *(void **)(in_RDI + 0x3d0) = local_530[2];
                      *(undefined4 *)(in_RDI + 0x3d8) = *(undefined4 *)(local_530 + 3);
                      *(void **)(in_RDI + 0x3e0) = local_530[4];
                      *(undefined4 *)(in_RDI + 1000) = *(undefined4 *)(local_530 + 5);
                      *(undefined4 *)(in_RDI + 0x3ec) = *(undefined4 *)((long)local_530 + 0x2c);
                      *(undefined4 *)(in_RDI + 0x3f0) = *(undefined4 *)(local_530 + 6);
                      *(undefined4 *)(in_RDI + 0x3f4) = *(undefined4 *)((long)local_530 + 0x34);
                      *(undefined4 *)(in_RDI + 0x3f8) = *(undefined4 *)(local_530 + 7);
                      *(void **)(in_RDI + 0x400) = local_530[8];
                    }
                    local_558 = &local_940;
                    local_520 = ppvVar2;
                    local_2a0 = local_558;
                    if (local_938 != (int *)0x0) {
                      local_2a4 = 0xffffffff;
                      LOCK();
                      local_2a8 = *local_938;
                      *local_938 = *local_938 + -1;
                      UNLOCK();
                      if (local_2a8 == 1) {
                        if (local_920 == (long *)0x0) {
                          if (local_940 != (void *)0x0) {
                            free(local_940);
                          }
                        }
                        else {
                          (**(code **)(*local_920 + 0x18))(local_920,local_940);
                        }
                      }
                    }
                    local_940 = (void *)0x0;
                    local_930 = 0;
                    local_928 = 0;
                    local_918 = 0;
                    local_914 = 0;
                    local_910 = 0;
                    local_90c = 0;
                    local_908 = 0;
                    local_900 = 0;
                    local_938 = (int *)0x0;
                    (**(code **)(*local_610 + 0x10))(&local_988,local_610,1);
                    local_390 = &local_988;
                    local_398 = 0;
                    *(undefined4 *)(in_RDI + 0x408) = *local_988;
                    local_548 = &local_988;
                    if (local_980 != (int *)0x0) {
                      local_2c4 = 0xffffffff;
                      LOCK();
                      local_2c8 = *local_980;
                      *local_980 = *local_980 + -1;
                      UNLOCK();
                      if (local_2c8 == 1) {
                        local_2c0 = local_548;
                        if (local_968 == (long *)0x0) {
                          if (local_988 != (undefined4 *)0x0) {
                            free(local_988);
                          }
                        }
                        else {
                          (**(code **)(*local_968 + 0x18))(local_968,local_988);
                        }
                      }
                    }
                  }
                  local_5fc = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_5fc;
}

Assistant:

int MultiHeadAttention::load_model(const ModelBin& mb)
{
    const int qdim = weight_data_size / embed_dim;

    q_weight_data = mb.load(embed_dim * qdim, 0);
    if (q_weight_data.empty())
        return -100;

    q_bias_data = mb.load(embed_dim, 1);
    if (q_bias_data.empty())
        return -100;

    k_weight_data = mb.load(embed_dim * kdim, 0);
    if (k_weight_data.empty())
        return -100;

    k_bias_data = mb.load(embed_dim, 1);
    if (k_bias_data.empty())
        return -100;

    v_weight_data = mb.load(embed_dim * vdim, 0);
    if (v_weight_data.empty())
        return -100;

    v_bias_data = mb.load(embed_dim, 1);
    if (v_bias_data.empty())
        return -100;

    out_weight_data = mb.load(qdim * embed_dim, 0);
    if (out_weight_data.empty())
        return -100;

    out_bias_data = mb.load(qdim, 1);
    if (out_bias_data.empty())
        return -100;

#if NCNN_INT8
    if (int8_scale_term)
    {
        q_weight_data_int8_scales = mb.load(embed_dim, 1);
        k_weight_data_int8_scales = mb.load(embed_dim, 1);
        v_weight_data_int8_scales = mb.load(embed_dim, 1);
        out_weight_data_int8_scale = mb.load(1, 1)[0];
    }
#endif // NCNN_INT8

    return 0;
}